

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O3

void __thiscall rtc::Buffer::Buffer(Buffer *this,Buffer *buf)

{
  size_t sVar1;
  ostream *poVar2;
  FatalMessage local_188;
  
  sVar1 = size(buf);
  this->size_ = sVar1;
  sVar1 = capacity(buf);
  this->capacity_ = sVar1;
  (this->data_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (buf->data_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
       ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  (buf->data_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
  .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  if ((this->capacity_ == 0 ||
       (this->data_)._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != (uchar *)0x0) &&
     (this->size_ <= this->capacity_)) {
    buf->size_ = 1;
    buf->capacity_ = 0;
    return;
  }
  FatalMessage::FatalMessage
            (&local_188,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/buffer.cc"
             ,0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_188,"Check failed: IsConsistent()",0x1c);
  std::ios::widen((char)&local_188 + (char)*(undefined8 *)(local_188._0_8_ + -0x18));
  std::ostream::put((char)&local_188);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"# ",2);
  FatalMessage::~FatalMessage(&local_188);
}

Assistant:

Buffer::Buffer(Buffer&& buf)
    : size_(buf.size()),
      capacity_(buf.capacity()),
      data_(std::move(buf.data_)) {
  RTC_DCHECK(IsConsistent());
  buf.OnMovedFrom();
}